

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int a;
  int in_ESI;
  lua_State *in_RDI;
  int j;
  int i;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  while( true ) {
    if (in_EDX <= in_ESI) {
      return;
    }
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    iVar1 = sort_comp(in_RDI,in_ESI,in_EDX);
    if (iVar1 == 0) {
      lua_settop(in_RDI,-3);
      iVar1 = in_EDX;
      a = in_ESI;
    }
    else {
      set2((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
      ;
      iVar1 = in_EDX;
      a = in_ESI;
    }
    if (iVar1 - a == 1) break;
    iVar2 = (a + iVar1) / 2;
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    iVar3 = sort_comp(in_RDI,a,iVar1);
    if (iVar3 == 0) {
      lua_settop(in_RDI,-2);
      lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      iVar3 = sort_comp(in_RDI,a,iVar1);
      if (iVar3 == 0) {
        lua_settop(in_RDI,-3);
      }
      else {
        set2((lua_State *)CONCAT44(a,iVar1),iVar2,in_stack_ffffffffffffffe8);
      }
    }
    else {
      set2((lua_State *)CONCAT44(a,iVar1),iVar2,in_stack_ffffffffffffffe8);
    }
    if (iVar1 - a == 2) {
      return;
    }
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    lua_pushvalue(_j,(int)((ulong)in_RDI >> 0x20));
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    set2((lua_State *)CONCAT44(a,iVar1),iVar2,in_stack_ffffffffffffffe8);
    iVar2 = iVar1 + -1;
    in_ESI = a;
    while( true ) {
      while( true ) {
        a = a + 1;
        lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        iVar3 = sort_comp(in_RDI,in_ESI,iVar1);
        if (iVar3 == 0) break;
        if (iVar1 < a) {
          luaL_error(in_RDI,"invalid order function for sorting");
        }
        lua_settop(in_RDI,-2);
      }
      while( true ) {
        iVar2 = iVar2 + -1;
        lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        iVar3 = sort_comp(in_RDI,in_ESI,iVar1);
        if (iVar3 == 0) break;
        if (iVar2 < in_ESI) {
          luaL_error(in_RDI,"invalid order function for sorting");
        }
        lua_settop(in_RDI,-2);
      }
      if (iVar2 < a) break;
      set2((lua_State *)CONCAT44(in_ESI,iVar1),a,iVar2);
    }
    lua_settop(in_RDI,-4);
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    lua_rawgeti(_j,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    set2((lua_State *)CONCAT44(in_ESI,iVar1),a,iVar2);
    if (a - in_ESI < iVar1 - a) {
      in_stack_ffffffffffffffe8 = in_ESI;
      in_stack_ffffffffffffffec = a + -1;
      in_EDX = iVar1;
      in_ESI = a + 1;
    }
    else {
      in_stack_ffffffffffffffe8 = a + 1;
      in_EDX = a + -1;
      in_stack_ffffffffffffffec = iVar1;
    }
    auxsort((lua_State *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
           );
  }
  return;
}

Assistant:

static void auxsort(lua_State*L,int l,int u){
while(l<u){
int i,j;
lua_rawgeti(L,1,l);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,l,u);
else
lua_pop(L,2);
if(u-l==1)break;
i=(l+u)/2;
lua_rawgeti(L,1,i);
lua_rawgeti(L,1,l);
if(sort_comp(L,-2,-1))
set2(L,i,l);
else{
lua_pop(L,1);
lua_rawgeti(L,1,u);
if(sort_comp(L,-1,-2))
set2(L,i,u);
else
lua_pop(L,2);
}
if(u-l==2)break;
lua_rawgeti(L,1,i);
lua_pushvalue(L,-1);
lua_rawgeti(L,1,u-1);
set2(L,i,u-1);
i=l;j=u-1;
for(;;){
while(lua_rawgeti(L,1,++i),sort_comp(L,-1,-2)){
if(i>u)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
while(lua_rawgeti(L,1,--j),sort_comp(L,-3,-1)){
if(j<l)luaL_error(L,"invalid order function for sorting");
lua_pop(L,1);
}
if(j<i){
lua_pop(L,3);
break;
}
set2(L,i,j);
}
lua_rawgeti(L,1,u-1);
lua_rawgeti(L,1,i);
set2(L,u-1,i);
if(i-l<u-i){
j=l;i=i-1;l=i+2;
}
else{
j=i+1;i=u;u=j-2;
}
auxsort(L,j,i);
}
}